

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O1

void __thiscall duckdb::ExtraTypeInfo::ExtraTypeInfo(ExtraTypeInfo *this,ExtraTypeInfo *other)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  type __x;
  pointer __p;
  pointer *__ptr;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
  local_30;
  
  this->_vptr_ExtraTypeInfo = (_func_int **)&PTR__ExtraTypeInfo_02479540;
  this->type = other->type;
  (this->alias)._M_dataplus._M_p = (pointer)&(this->alias).field_2;
  pcVar1 = (other->alias)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->alias,pcVar1,pcVar1 + (other->alias)._M_string_length);
  (this->extension_info).
  super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl = (ExtensionTypeInfo *)0x0
  ;
  if ((other->extension_info).
      super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
      .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl !=
      (ExtensionTypeInfo *)0x0) {
    __x = unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
          ::operator*(&other->extension_info);
    __p = (pointer)operator_new(0x50);
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               __p,(vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                    *)__x);
    local_30._M_h = (__hashtable_alloc *)&__p->properties;
    (__p->properties)._M_h._M_buckets = (__buckets_ptr)0x0;
    (__p->properties)._M_h._M_bucket_count = (__x->properties)._M_h._M_bucket_count;
    (__p->properties)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p->properties)._M_h._M_element_count = (__x->properties)._M_h._M_element_count;
    uVar3 = *(undefined4 *)&(__x->properties)._M_h._M_rehash_policy.field_0x4;
    sVar2 = (__x->properties)._M_h._M_rehash_policy._M_next_resize;
    (__p->properties)._M_h._M_rehash_policy._M_max_load_factor =
         (__x->properties)._M_h._M_rehash_policy._M_max_load_factor;
    *(undefined4 *)&(__p->properties)._M_h._M_rehash_policy.field_0x4 = uVar3;
    (__p->properties)._M_h._M_rehash_policy._M_next_resize = sVar2;
    (__p->properties)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_30._M_h,&(__x->properties)._M_h,&local_30);
    std::__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
    ::reset((__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
             *)&this->extension_info,__p);
  }
  return;
}

Assistant:

ExtraTypeInfo::ExtraTypeInfo(const ExtraTypeInfo &other) : type(other.type), alias(other.alias) {
	if (other.extension_info) {
		extension_info = make_uniq<ExtensionTypeInfo>(*other.extension_info);
	}
}